

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ch.cpp
# Opt level: O2

HRESULT CreateParserState(LPCSTR fileContents,size_t fileLength,
                         JsFinalizeCallback fileContentsFinalizeCallback,LPCWSTR fullPath)

{
  code *pcVar1;
  JsErrorCode jsErrorCode;
  int iVar2;
  BOOL BVar3;
  PAL_FILE *pPVar4;
  LPCWSTR pWVar5;
  HANDLE hFile;
  HRESULT HVar6;
  ulong uVar7;
  JsValueRef local_50;
  JsValueRef parserStateBuffer;
  BYTE *buffer;
  uint local_38;
  DWORD DStack_34;
  char scratch [3];
  uint bufferSize;
  DWORD written;
  
  local_50 = (JsValueRef)0x0;
  parserStateBuffer = (JsValueRef)0x0;
  local_38 = 0;
  GetParserStateBuffer(fileContents,fileContentsFinalizeCallback,&local_50);
  jsErrorCode = (*ChakraRTInterface::m_jsApiHooks.pfJsrtGetArrayBufferStorage)
                          (local_50,(BYTE **)&parserStateBuffer,&local_38);
  if (jsErrorCode == JsNoError) {
    hFile = GetFileHandle(fullPath);
    HVar6 = -0x7fffbffb;
    if (1 < (long)hFile + 1U) {
      for (uVar7 = 0; uVar7 < local_38; uVar7 = uVar7 + 1) {
        DStack_34 = 0;
        iVar2 = _snprintf_unsafe((char *)((long)&buffer + 5),3,3,"%02X");
        if (iVar2 != 2) {
          pPVar4 = PAL_get_stderr(0);
          PAL_fprintf(pPVar4,"ASSERTION (%s, line %d) %s %s\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/bin/ch/ch.cpp"
                      ,0x267,"num == 2","num == 2");
          pPVar4 = PAL_get_stderr(0);
          PAL_fflush(pPVar4);
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        BVar3 = WriteFile(hFile,(char *)((long)&buffer + 5),2,&stack0xffffffffffffffcc,
                          (LPOVERLAPPED)0x0);
        if (BVar3 == 0) goto LAB_00108193;
        if (((~(uint)uVar7 & 0x1f) == 0) && (uVar7 < local_38 - 1)) {
          BVar3 = WriteFile(hFile,"\n",1,&stack0xffffffffffffffcc,(LPOVERLAPPED)0x0);
          if (BVar3 == 0) goto LAB_00108193;
        }
      }
      HVar6 = 0;
    }
LAB_00108193:
    if (hFile != (HANDLE)0x0) {
      CloseHandle(hFile);
    }
  }
  else {
    HVar6 = 0;
    pPVar4 = PAL_get_stderr(0);
    pWVar5 = Helpers::JsErrorCodeToString(jsErrorCode);
    PAL_fwprintf(pPVar4,
                 L"ERROR: ChakraRTInterface::JsGetArrayBufferStorage(parserStateBuffer, &buffer, &bufferSize) failed. JsErrorCode=0x%x (%s)\n"
                 ,(ulong)jsErrorCode,pWVar5);
    pPVar4 = PAL_get_stderr(0);
    PAL_fflush(pPVar4);
  }
  return HVar6;
}

Assistant:

HRESULT CreateParserState(LPCSTR fileContents, size_t fileLength, JsFinalizeCallback fileContentsFinalizeCallback, LPCWSTR fullPath)
{
    HRESULT hr = S_OK;
    HANDLE fileHandle = nullptr;
    JsValueRef parserStateBuffer = nullptr;
    BYTE *buffer = nullptr;
    unsigned int bufferSize = 0;

    IfFailedGoLabel(GetParserStateBuffer(fileContents, fileContentsFinalizeCallback, &parserStateBuffer), Error);
    IfJsErrorFailLog(ChakraRTInterface::JsGetArrayBufferStorage(parserStateBuffer, &buffer, &bufferSize));

    fileHandle = GetFileHandle(fullPath);
    IfFalseGo(fileHandle != INVALID_HANDLE_VALUE && fileHandle != nullptr);

    for (unsigned int i = 0; i < bufferSize; i++)
    {
        const unsigned int BYTES_PER_LINE = 32;
        DWORD written = 0;
        char scratch[3];
        auto scratchLen = sizeof(scratch);
        int num = _snprintf_s(scratch, scratchLen, _countof(scratch), "%02X", buffer[i]);
        Assert(num == 2);
        IfFalseGo(WriteFile(fileHandle, scratch, (DWORD)(scratchLen - 1), &written, nullptr));

        // Add line breaks so this block can be readable
        if (i % BYTES_PER_LINE == (BYTES_PER_LINE - 1) && i < bufferSize - 1)
        {
            IfFalseGo(WriteFile(fileHandle, "\n", 1, &written, nullptr));
        }
    }

Error:
    if (fileHandle != nullptr)
    {
        CloseHandle(fileHandle);
    }
    return hr;
}